

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsumption_graph.hh
# Opt level: O1

void __thiscall
tchecker::graph::subsumption::
graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
::clear(graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
        *this)

{
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_le_t>
  *this_00;
  const_iterator_t local_90;
  const_iterator_t local_50;
  
  this_00 = &this->_cover_graph;
  collision_table_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t>
  ::begin(&local_50,&this_00->_nodes);
  collision_table_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t>
  ::end(&local_90,&this_00->_nodes);
  directed::
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>>
  ::
  clear<tchecker::join_iterator_t<tchecker::range_t<__gnu_cxx::__normal_iterator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>>>const*,std::vector<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>>>,std::allocator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared___hecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>>>>>>>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t>,unsigned_long,1ul>>>
              *)&this->field_0x78,&local_50,&local_90);
  if (local_90._get_sub_range.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_90._get_sub_range.super__Function_base._M_manager)
              ((_Any_data *)&local_90._get_sub_range,(_Any_data *)&local_90._get_sub_range,
               __destroy_functor);
  }
  if (local_50._get_sub_range.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50._get_sub_range.super__Function_base._M_manager)
              ((_Any_data *)&local_50._get_sub_range,(_Any_data *)&local_50._get_sub_range,
               __destroy_functor);
  }
  collision_table_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t>
  ::clear(&this_00->_nodes);
  pool_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  ::destruct_all(&(this->_node_pool)._node_pool);
  pool_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  ::destruct_all(&(this->_edge_pool)._edge_pool);
  return;
}

Assistant:

void clear()
  {
    _directed_graph.clear(_cover_graph.begin(), _cover_graph.end());
    _cover_graph.clear();
    _node_pool.destruct_all();
    _edge_pool.destruct_all();
  }